

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int renameResolveTrigger(Parse *pParse)

{
  int iVar1;
  sqlite3 *db;
  Trigger *pTVar2;
  Schema *pSVar3;
  anon_union_8_4_82a96254_for_uNC aVar4;
  uint uVar5;
  Table *pTable;
  SrcList *pSrc;
  Select *pSVar6;
  SrcList *pSVar7;
  long lVar8;
  Schema **ppSVar9;
  Upsert *pUpsert;
  long lVar10;
  TriggerStep *pStep;
  NameContext sNC;
  
  db = pParse->db;
  pTVar2 = pParse->pNewTrigger;
  sNC.pSrcList = (SrcList *)0x0;
  sNC.nRef = 0;
  sNC.nNcErr = 0;
  sNC.ncFlags = 0;
  sNC._44_4_ = 0;
  sNC.uNC.pEList = (ExprList *)0x0;
  sNC.pNext = (NameContext *)0x0;
  sNC.pWinSelect = (Select *)0x0;
  if (pTVar2->pTabSchema == (Schema *)0x0) {
    lVar8 = -0x8000;
  }
  else {
    lVar8 = -0x100000000;
    ppSVar9 = &db->aDb->pSchema;
    do {
      lVar8 = lVar8 + 0x100000000;
      pSVar3 = *ppSVar9;
      ppSVar9 = ppSVar9 + 4;
    } while (pSVar3 != pTVar2->pTabSchema);
    lVar8 = lVar8 >> 0x20;
  }
  sNC.pParse = pParse;
  pTable = sqlite3FindTable(db,pTVar2->table,db->aDb[lVar8].zDbSName);
  pParse->pTriggerTab = pTable;
  pParse->eTriggerOp = pTVar2->op;
  uVar5 = 0;
  if ((pTable != (Table *)0x0) && ((pTable->eTabType == '\x01' || (uVar5 = 0, pTable->nCol < 1)))) {
    uVar5 = viewGetColumnNames(pParse,pTable);
  }
  if (uVar5 == 0) {
    if (pTVar2->pWhen == (Expr *)0x0) {
      uVar5 = 0;
    }
    else {
      uVar5 = sqlite3ResolveExprNames(&sNC,pTVar2->pWhen);
    }
  }
  pStep = pTVar2->step_list;
  if (pStep != (TriggerStep *)0x0 && uVar5 == 0) {
    do {
      uVar5 = 0;
      if (pStep->pSelect != (Select *)0x0) {
        sqlite3SelectPrep(pParse,pStep->pSelect,&sNC);
        uVar5 = 0;
        if (pParse->nErr != 0) {
          uVar5 = pParse->rc;
        }
      }
      if (uVar5 == 0) {
        if (pStep->zTarget == (char *)0x0) {
          uVar5 = 0;
        }
        else {
          pSrc = sqlite3TriggerStepSrc(pParse,pStep);
          if (pSrc == (SrcList *)0x0) {
            uVar5 = 7;
          }
          else {
            pSVar6 = sqlite3SelectNew(pParse,pStep->pExprList,pSrc,(Expr *)0x0,(ExprList *)0x0,
                                      (Expr *)0x0,(ExprList *)0x0,0,(Expr *)0x0);
            if (pSVar6 == (Select *)0x0) {
              pStep->pExprList = (ExprList *)0x0;
              uVar5 = 7;
              pSrc = (SrcList *)0x0;
            }
            else {
              sqlite3SelectPrep(pParse,pSVar6,(NameContext *)0x0);
              iVar1 = pParse->nErr;
              if (pStep->pExprList != (ExprList *)0x0) {
                pSVar6->pEList = (ExprList *)0x0;
              }
              uVar5 = (uint)(iVar1 != 0);
              pSVar6->pSrc = (SrcList *)0x0;
              clearSelect(db,pSVar6,1);
            }
            if (((pStep->pFrom != (SrcList *)0x0) && (pSVar7 = pStep->pFrom, 0 < pSVar7->nSrc)) &&
               (uVar5 == 0)) {
              lVar10 = 0x30;
              lVar8 = 1;
              while( true ) {
                pSVar6 = *(Select **)((long)pSVar7->a + lVar10 + -8);
                if (pSVar6 != (Select *)0x0) {
                  sqlite3SelectPrep(pParse,pSVar6,(NameContext *)0x0);
                }
                pSVar7 = pStep->pFrom;
                if (pSVar7->nSrc <= lVar8) break;
                lVar10 = lVar10 + 0x68;
                lVar8 = lVar8 + 1;
              }
            }
            if (db->mallocFailed != '\0') {
              uVar5 = 7;
            }
            sNC.pSrcList = pSrc;
            if (uVar5 == 0) {
              if (pStep->pWhere == (Expr *)0x0) {
                uVar5 = 0;
              }
              else {
                uVar5 = sqlite3ResolveExprNames(&sNC,pStep->pWhere);
              }
            }
            if (uVar5 == 0) {
              uVar5 = sqlite3ResolveExprListNames(&sNC,pStep->pExprList);
            }
            aVar4 = (anon_union_8_4_82a96254_for_uNC)pStep->pUpsert;
            if (uVar5 == 0 && (Upsert *)aVar4.pEList != (Upsert *)0x0) {
              (aVar4.pUpsert)->pUpsertSrc = pSrc;
              sNC.ncFlags = 0x200;
              sNC.uNC = aVar4;
              uVar5 = sqlite3ResolveExprListNames(&sNC,(aVar4.pUpsert)->pUpsertTarget);
              if (uVar5 == 0) {
                uVar5 = sqlite3ResolveExprListNames(&sNC,(aVar4.pUpsert)->pUpsertSet);
              }
              if (uVar5 == 0) {
                uVar5 = sqlite3ResolveExprNames(&sNC,*(Expr **)&(aVar4.pEList)->a[0].fg);
              }
              if (uVar5 == 0) {
                uVar5 = sqlite3ResolveExprNames(&sNC,(aVar4.pEList)->a[0].pExpr);
              }
              sNC._40_8_ = sNC._40_8_ & 0xffffffff00000000;
            }
            sNC.pSrcList = (SrcList *)0x0;
            sqlite3SrcListDelete(db,pSrc);
          }
        }
      }
    } while ((uVar5 == 0) && (pStep = pStep->pNext, pStep != (TriggerStep *)0x0));
  }
  return uVar5;
}

Assistant:

static int renameResolveTrigger(Parse *pParse){
  sqlite3 *db = pParse->db;
  Trigger *pNew = pParse->pNewTrigger;
  TriggerStep *pStep;
  NameContext sNC;
  int rc = SQLITE_OK;

  memset(&sNC, 0, sizeof(sNC));
  sNC.pParse = pParse;
  assert( pNew->pTabSchema );
  pParse->pTriggerTab = sqlite3FindTable(db, pNew->table,
      db->aDb[sqlite3SchemaToIndex(db, pNew->pTabSchema)].zDbSName
  );
  pParse->eTriggerOp = pNew->op;
  /* ALWAYS() because if the table of the trigger does not exist, the
  ** error would have been hit before this point */
  if( ALWAYS(pParse->pTriggerTab) ){
    rc = sqlite3ViewGetColumnNames(pParse, pParse->pTriggerTab);
  }

  /* Resolve symbols in WHEN clause */
  if( rc==SQLITE_OK && pNew->pWhen ){
    rc = sqlite3ResolveExprNames(&sNC, pNew->pWhen);
  }

  for(pStep=pNew->step_list; rc==SQLITE_OK && pStep; pStep=pStep->pNext){
    if( pStep->pSelect ){
      sqlite3SelectPrep(pParse, pStep->pSelect, &sNC);
      if( pParse->nErr ) rc = pParse->rc;
    }
    if( rc==SQLITE_OK && pStep->zTarget ){
      SrcList *pSrc = sqlite3TriggerStepSrc(pParse, pStep);
      if( pSrc ){
        Select *pSel = sqlite3SelectNew(
            pParse, pStep->pExprList, pSrc, 0, 0, 0, 0, 0, 0
        );
        if( pSel==0 ){
          pStep->pExprList = 0;
          pSrc = 0;
          rc = SQLITE_NOMEM;
        }else{
          sqlite3SelectPrep(pParse, pSel, 0);
          rc = pParse->nErr ? SQLITE_ERROR : SQLITE_OK;
          assert( pStep->pExprList==0 || pStep->pExprList==pSel->pEList );
          assert( pSrc==pSel->pSrc );
          if( pStep->pExprList ) pSel->pEList = 0;
          pSel->pSrc = 0;
          sqlite3SelectDelete(db, pSel);
        }
        if( pStep->pFrom ){
          int i;
          for(i=0; i<pStep->pFrom->nSrc && rc==SQLITE_OK; i++){
            SrcItem *p = &pStep->pFrom->a[i];
            if( p->pSelect ){
              sqlite3SelectPrep(pParse, p->pSelect, 0);
            }
          }
        }

        if(  db->mallocFailed ){
          rc = SQLITE_NOMEM;
        }
        sNC.pSrcList = pSrc;
        if( rc==SQLITE_OK && pStep->pWhere ){
          rc = sqlite3ResolveExprNames(&sNC, pStep->pWhere);
        }
        if( rc==SQLITE_OK ){
          rc = sqlite3ResolveExprListNames(&sNC, pStep->pExprList);
        }
        assert( !pStep->pUpsert || (!pStep->pWhere && !pStep->pExprList) );
        if( pStep->pUpsert && rc==SQLITE_OK ){
          Upsert *pUpsert = pStep->pUpsert;
          pUpsert->pUpsertSrc = pSrc;
          sNC.uNC.pUpsert = pUpsert;
          sNC.ncFlags = NC_UUpsert;
          rc = sqlite3ResolveExprListNames(&sNC, pUpsert->pUpsertTarget);
          if( rc==SQLITE_OK ){
            ExprList *pUpsertSet = pUpsert->pUpsertSet;
            rc = sqlite3ResolveExprListNames(&sNC, pUpsertSet);
          }
          if( rc==SQLITE_OK ){
            rc = sqlite3ResolveExprNames(&sNC, pUpsert->pUpsertWhere);
          }
          if( rc==SQLITE_OK ){
            rc = sqlite3ResolveExprNames(&sNC, pUpsert->pUpsertTargetWhere);
          }
          sNC.ncFlags = 0;
        }
        sNC.pSrcList = 0;
        sqlite3SrcListDelete(db, pSrc);
      }else{
        rc = SQLITE_NOMEM;
      }
    }
  }
  return rc;
}